

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O0

void Gia_Iso3Init(Gia_Man_t *p)

{
  uint uVar1;
  bool bVar2;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    uVar1 = Gia_Iso3Node(pGStack_18);
    pGStack_18->Value = uVar1;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_Iso3Init( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = Gia_Iso3Node( pObj );
}